

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint params_2;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  allocator local_e1;
  char *local_e0;
  DecimalCastData<long> local_d8;
  undefined4 local_c0;
  uint local_bc;
  ulong local_b8;
  ExponentData exponent;
  string_t value;
  string local_70;
  string local_50 [32];
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_d8.result = 0;
  local_d8.digit_count = '\0';
  local_d8.decimal_count = '\0';
  local_d8.round_set = false;
  local_d8.should_round = false;
  local_c0 = (undefined4)CONCAT71(in_register_00000081,width);
  local_d8.excessive_decimals = '\0';
  local_d8.exponent_type = NONE;
  local_d8.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  for (uVar9 = 0; uVar7 = string_size - uVar9, local_d8.width = width, local_d8.scale = scale,
      local_bc = params_2, uVar7 != 0; uVar9 = uVar9 + 1) {
    bVar2 = string_ptr[uVar9];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
      if (bVar2 == 0x2d) {
        uVar8 = string_size - uVar9;
        uVar7 = 1;
        goto LAB_0166a4ac;
      }
      if (bVar2 != 0x30 || string_size - 1 == uVar9) {
LAB_0166a587:
        uVar4 = (ulong)(bVar2 == 0x2b);
        uVar8 = uVar4;
        goto LAB_0166a596;
      }
      bVar1 = (bool)string_ptr[uVar9 + 1];
      if (bVar1 != true) {
        if (bVar1 != true) {
          if (bVar1 == true) goto LAB_0166a6dc;
          if (bVar1 != true) goto LAB_0166a587;
        }
        bVar1 = IntegerHexCastLoop<duckdb::DecimalCastData<long>,false,false,duckdb::DecimalCastOperation>
                          (string_ptr + uVar9 + 1,~uVar9 + string_size,&local_d8,bVar1);
        goto LAB_0166a57a;
      }
LAB_0166a6dc:
      if (0xfffffffffffffffd < (string_size - uVar9) - 3) {
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_d8);
      }
      break;
    }
  }
  goto LAB_0166aa12;
  while( true ) {
    bVar2 = string_ptr[uVar9 + uVar4];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2e) goto LAB_0166a7d9;
      uVar7 = uVar4 + 1;
      uVar5 = uVar7;
      goto LAB_0166a64a;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<long>,true>
                      (&local_d8,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar7 = uVar8, ~uVar4 + string_size != uVar9 &&
         (uVar7 = uVar4 + 1, string_ptr[uVar9 + 1 + uVar4] == '_')) &&
        (((string_size - uVar4) - 2 == uVar9 ||
         (uVar7 = uVar4 + 2, 9 < (byte)(string_ptr[uVar9 + 2 + uVar4] - 0x30U))))))) break;
LAB_0166a4ac:
    uVar4 = uVar7;
    if (uVar8 <= uVar4) goto LAB_0166a618;
  }
  goto LAB_0166aa12;
LAB_0166a64a:
  uVar3 = uVar5;
  if (uVar8 <= uVar3) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (uVar7 < uVar3 || bVar1) goto LAB_0166a618;
    goto LAB_0166aa12;
  }
  local_e0 = string_ptr + uVar3;
  bVar2 = local_e0[uVar9];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = 1 < uVar4;
    uVar4 = uVar3;
    if (uVar7 < uVar3 || bVar1) goto LAB_0166a7d9;
    goto LAB_0166aa12;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<long>,true,true>
                    (&local_d8,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar5 = uVar8, ~uVar3 + string_size != uVar9 &&
       (uVar5 = uVar3 + 1, local_e0[uVar9 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar9 ||
       (uVar5 = uVar3 + 2, 9 < (byte)(local_e0[uVar9 + 2] - 0x30U))))))) goto LAB_0166aa12;
  goto LAB_0166a64a;
LAB_0166a7d9:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar4 == 1) || (uVar8 <= uVar4 + 1)) goto LAB_0166aa12;
      exponent.result = 0;
      pcVar6 = string_ptr + uVar9 + uVar4 + 1;
      iVar10 = ~uVar9 + (string_size - uVar4);
      if (*pcVar6 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar10,&exponent,false);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar10,&exponent,false);
      }
      if (bVar1 == false) goto LAB_0166aa12;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                        (&local_d8,(int)exponent.result);
      goto LAB_0166a57a;
    }
    if (bVar2 != 0x20) goto LAB_0166aa12;
  }
  uVar7 = uVar4 + 1;
  uVar4 = uVar7;
  if (uVar7 < uVar8) {
    uVar4 = uVar8;
  }
  for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar9 + uVar7]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar9 + uVar7] & 0x3f) & 1) == 0))
    goto LAB_0166aa12;
  }
LAB_0166a618:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_d8);
  if ((bVar1) && (1 < uVar4)) goto LAB_0166a71f;
  goto LAB_0166aa12;
LAB_0166a744:
  uVar3 = uVar8;
  if (uVar7 <= uVar3) {
    bVar1 = uVar4 < uVar5;
    uVar5 = uVar3;
    if (local_b8 < uVar3 || bVar1) goto LAB_0166a702;
    goto LAB_0166aa12;
  }
  local_e0 = string_ptr + uVar3;
  bVar2 = local_e0[uVar9];
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar1 = uVar4 < uVar5;
    uVar5 = uVar3;
    if (local_b8 < uVar3 || bVar1) goto LAB_0166a831;
    goto LAB_0166aa12;
  }
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<long>,false,true>
                    (&local_d8,bVar2 - 0x30);
  if ((!bVar1) ||
     (((uVar8 = uVar7, ~uVar3 + string_size != uVar9 &&
       (uVar8 = uVar3 + 1, local_e0[uVar9 + 1] == '_')) &&
      (((string_size - uVar3) - 2 == uVar9 ||
       (uVar8 = uVar3 + 2, 9 < (byte)(local_e0[uVar9 + 2] - 0x30U))))))) goto LAB_0166aa12;
  goto LAB_0166a744;
LAB_0166a831:
  if (4 < bVar2 - 9) {
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar5 == uVar4) || (uVar7 <= uVar5 + 1)) goto LAB_0166aa12;
      exponent.result = 0;
      pcVar6 = string_ptr + uVar9 + uVar5 + 1;
      iVar10 = ~uVar9 + (string_size - uVar5);
      if (*pcVar6 == '-') {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar10,&exponent,false);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar6,iVar10,&exponent,false);
      }
      if (bVar1 == false) goto LAB_0166aa12;
      bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                        (&local_d8,(int)exponent.result);
LAB_0166a57a:
      if (bVar1 != false) goto LAB_0166a71f;
      goto LAB_0166aa12;
    }
    if (bVar2 != 0x20) goto LAB_0166aa12;
  }
  uVar8 = uVar5 + 1;
  uVar5 = uVar8;
  if (uVar8 < uVar7) {
    uVar5 = uVar7;
  }
  for (; uVar8 < uVar7; uVar8 = uVar8 + 1) {
    if ((0x20 < (ulong)(byte)string_ptr[uVar9 + uVar8]) ||
       ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar9 + uVar8] & 0x3f) & 1) == 0))
    goto LAB_0166aa12;
  }
LAB_0166a702:
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_d8);
  if ((bVar1) && (uVar4 < uVar5)) {
LAB_0166a71f:
    *result = local_d8.result;
    return true;
  }
  goto LAB_0166aa12;
  while( true ) {
    bVar2 = string_ptr[uVar9 + uVar5];
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 != 0x2e) goto LAB_0166a831;
      local_b8 = uVar5 + 1;
      uVar8 = local_b8;
      goto LAB_0166a744;
    }
    bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<long>,false>
                      (&local_d8,bVar2 - 0x30);
    if ((!bVar1) ||
       (((uVar8 = uVar7, ~uVar5 + string_size != uVar9 &&
         (uVar8 = uVar5 + 1, string_ptr[uVar9 + 1 + uVar5] == '_')) &&
        (((string_size - uVar5) - 2 == uVar9 ||
         (uVar8 = uVar5 + 2, 9 < (byte)(string_ptr[uVar9 + 2 + uVar5] - 0x30U))))))) break;
LAB_0166a596:
    uVar5 = uVar8;
    if (uVar7 <= uVar5) goto LAB_0166a702;
  }
LAB_0166aa12:
  value.value.pointer.length = (uint32_t)string_size;
  if (value.value.pointer.length < 0xd) {
    value.value._12_4_ = 0;
    value.value._4_1_ = '\0';
    value.value._5_1_ = '\0';
    value.value._6_1_ = '\0';
    value.value._7_1_ = '\0';
    value.value._8_4_ = 0;
    value.value.pointer.ptr = (char *)0x0;
    if (value.value.pointer.length != 0) {
      switchD_016b0717::default
                ((void *)((long)&value.value + 4),string_ptr,
                 (ulong)(value.value.pointer.length & 0xf));
      value.value.pointer.ptr = (char *)CONCAT44(value.value._12_4_,value.value._8_4_);
    }
  }
  else {
    value.value.pointer.prefix = (char  [4])*(undefined4 *)string_ptr;
    value.value.pointer.ptr = string_ptr;
  }
  ::std::__cxx11::string::string
            (local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)",&local_e1);
  string_t::GetString_abi_cxx11_(&local_70,&value);
  StringUtil::Format<std::__cxx11::string,int,int>
            ((string *)&exponent,(StringUtil *)local_50,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(byte)local_c0,local_bc & 0xff,params_2);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  HandleCastError::AssignError((string *)&exponent,parameters);
  ::std::__cxx11::string::~string((string *)&exponent);
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}